

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O2

FM_OPL * OPLCreate(UINT32 clock,UINT32 rate,int type)

{
  bool bVar1;
  FM_OPL *OPL;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  size_t __size;
  int *piVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  iVar4 = num_lock + 1;
  bVar1 = num_lock < 1;
  num_lock = iVar4;
  if ((bVar1) && (tablesInit == '\0')) {
    tablesInit = '\x01';
    piVar8 = tl_tab;
    lVar9 = 0;
    while (lVar9 != 0x100) {
      dVar10 = exp2((double)(int)(lVar9 + 1) * 0.03125 * 0.125);
      dVar10 = floor(65536.0 / dVar10);
      iVar4 = ((int)dVar10 >> 5) + (uint)(((uint)(int)dVar10 >> 4 & 1) != 0);
      tl_tab[lVar9 * 2] = iVar4 * 2;
      tl_tab[lVar9 * 2 + 1] = iVar4 * -2;
      bVar3 = 1;
      for (lVar7 = 0x804; lVar7 != 0x6004; lVar7 = lVar7 + 0x800) {
        iVar4 = tl_tab[lVar9 * 2] >> (bVar3 & 0x1f);
        *(int *)((long)piVar8 + lVar7 + -4) = iVar4;
        *(int *)((long)piVar8 + lVar7) = -iVar4;
        bVar3 = bVar3 + 1;
      }
      piVar8 = piVar8 + 2;
      lVar9 = lVar9 + 1;
    }
    iVar4 = 1;
    for (lVar9 = 0; lVar9 != 0x1000; lVar9 = lVar9 + 4) {
      dVar10 = sin((double)iVar4 * 3.141592653589793 * 0.0009765625);
      dVar11 = log(*(double *)(&DAT_001622f0 + (ulong)(0.0 < dVar10) * 8) / dVar10);
      dVar11 = ((dVar11 * 8.0) / 0.6931471805599453) * 32.0;
      *(uint *)((long)sin_tab + lVar9) =
           (uint)(dVar10 < 0.0) | (int)(dVar11 + dVar11) + 1U & 0xfffffffe;
      iVar4 = iVar4 + 2;
    }
    for (uVar2 = 0; uVar2 != 0x400; uVar2 = uVar2 + 1) {
      uVar5 = 0x1800;
      uVar6 = 0x1800;
      if (uVar2 < 0x200) {
        uVar6 = sin_tab[uVar2];
      }
      sin_tab[uVar2 + 0x400] = uVar6;
      sin_tab[uVar2 + 0x800] = sin_tab[(uint)uVar2 & 0x1ff];
      if (((uint)uVar2 >> 8 & 1) == 0) {
        uVar5 = sin_tab[uVar2 & 0xff];
      }
      sin_tab[uVar2 + 0xc00] = uVar5;
    }
  }
  __size = 0x1878;
  if ((type & 2U) == 0) {
    __size = 0x17d8;
  }
  OPL = (FM_OPL *)calloc(1,__size);
  if (OPL != (FM_OPL *)0x0) {
    if ((type & 2U) != 0) {
      OPL->deltat = (YM_DELTAT *)(OPL + 1);
    }
    OPL->type = (UINT8)type;
    OPL_clock_changed(OPL,clock,rate);
    opl_set_mute_mask(OPL,0);
  }
  return OPL;
}

Assistant:

static FM_OPL *OPLCreate(UINT32 clock, UINT32 rate, int type)
{
	char *ptr;
	FM_OPL *OPL;
	int state_size;

	if (OPL_LockTable() == -1) return NULL;

	/* calculate OPL state size */
	state_size  = sizeof(FM_OPL);

#if BUILD_Y8950
	if (type&OPL_TYPE_ADPCM) state_size+= sizeof(YM_DELTAT);
#endif

	/* allocate memory block */
	ptr = (char *)calloc(1, state_size);
	if (ptr==NULL)
		return NULL;

	OPL  = (FM_OPL *)ptr;

	ptr += sizeof(FM_OPL);

#if BUILD_Y8950
	if (type&OPL_TYPE_ADPCM)
	{
		OPL->deltat = (YM_DELTAT *)ptr;
		ptr += sizeof(YM_DELTAT);
	}
#endif

	OPL->type  = type;
	OPL_clock_changed(OPL, clock, rate);

	opl_set_mute_mask(OPL, 0x0000);

	return OPL;
}